

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O1

void stream_obq_remove(nghttp2_stream *stream)

{
  nghttp2_stream *pnVar1;
  int iVar2;
  
  if (stream->queued != '\0') {
    while (pnVar1 = stream->dep_prev, pnVar1 != (nghttp2_stream *)0x0) {
      nghttp2_pq_remove(&pnVar1->obq,&stream->pq_entry);
      if (stream->queued == '\0') {
        __assert_fail("stream->queued",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                      ,0xbf,"void stream_obq_remove(nghttp2_stream *)");
      }
      stream->queued = '\0';
      stream->pending_penalty = 0;
      stream->last_writelen = 0;
      stream->descendant_last_cycle = 0;
      stream->cycle = 0;
      if ((pnVar1->item != (nghttp2_outbound_item *)0x0) && ((pnVar1->flags & 0xc) == 0)) {
        return;
      }
      iVar2 = nghttp2_pq_empty(&pnVar1->obq);
      stream = pnVar1;
      if (iVar2 == 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

static void stream_obq_remove(nghttp2_stream *stream) {
  nghttp2_stream *dep_stream;

  dep_stream = stream->dep_prev;

  if (!stream->queued) {
    return;
  }

  for (; dep_stream; stream = dep_stream, dep_stream = dep_stream->dep_prev) {
    DEBUGF("stream: remove stream %d from stream %d\n", stream->stream_id,
           dep_stream->stream_id);

    nghttp2_pq_remove(&dep_stream->obq, &stream->pq_entry);

    assert(stream->queued);

    stream->queued = 0;
    stream->cycle = 0;
    stream->pending_penalty = 0;
    stream->descendant_last_cycle = 0;
    stream->last_writelen = 0;

    if (stream_subtree_active(dep_stream)) {
      return;
    }
  }
}